

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirWatcherGeneric.cpp
# Opt level: O2

void __thiscall efsw::DirWatcherGeneric::watchDir(DirWatcherGeneric *this,string *dir)

{
  bool *pbVar1;
  DirWatcherGeneric *this_00;
  string *dir_00;
  string sStack_58;
  string local_38;
  
  dir_00 = &sStack_58;
  pbVar1 = FileWatcher::allowOutOfScopeLinks(this->Watch->WatcherImpl->mFileWatcher);
  if (*pbVar1 == true) {
    dir_00 = &local_38;
    std::__cxx11::string::string((string *)dir_00,(string *)dir);
    this_00 = findDirWatcher(this,dir_00);
  }
  else {
    std::__cxx11::string::string((string *)&sStack_58,(string *)dir);
    this_00 = findDirWatcherFast(this,&sStack_58);
  }
  std::__cxx11::string::~string((string *)dir_00);
  if (this_00 != (DirWatcherGeneric *)0x0) {
    watch(this_00,true);
  }
  return;
}

Assistant:

void DirWatcherGeneric::watchDir( std::string &dir )
{
	DirWatcherGeneric * watcher = Watch->WatcherImpl->mFileWatcher->allowOutOfScopeLinks() ?
									findDirWatcher( dir ) :
									findDirWatcherFast( dir );

	if ( NULL != watcher )
	{
		watcher->watch( true );
	}
}